

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::expand
          (queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,size_t capacity)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  size_t *psVar3;
  size_t *psVar4;
  size_t i;
  long lVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  
  uVar6 = capacity << 5;
  psVar3 = (size_t *)operator_new__(-(ulong)(capacity >> 0x3b != 0) | uVar6 | 8);
  *psVar3 = capacity;
  if (capacity != 0) {
    psVar4 = psVar3 + 3;
    do {
      psVar4[-2] = (size_t)psVar4;
      psVar4[-1] = 0;
      *(undefined1 *)psVar4 = 0;
      psVar4 = psVar4 + 4;
      uVar6 = uVar6 - 0x20;
    } while (uVar6 != 0);
  }
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar3 + 1);
  for (uVar6 = 0; pbVar1 = this->mData, uVar6 < this->mSize; uVar6 = uVar6 + 1) {
    std::__cxx11::string::_M_assign((string *)pbVar7);
    pbVar7 = pbVar7 + 1;
  }
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    lVar2 = *(long *)((long)&pbVar1[-1].field_2 + 8);
    if (lVar2 != 0) {
      lVar5 = lVar2 << 5;
      do {
        std::__cxx11::string::~string((string *)((long)&pbVar1[-1]._M_dataplus._M_p + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != 0);
    }
    operator_delete__((void *)((long)&pbVar1[-1].field_2 + 8),lVar2 << 5 | 8);
  }
  this->mData = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar3 + 1);
  this->mCap = capacity;
  this->mFront = 0;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[(mFront + i) % mCap];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
      mFront = 0;
    }